

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<void,_void_()>::reject<QtPromise::QPromiseCanceledException>
          (PromiseDataBase<void,_void_()> *this,QPromiseCanceledException *error)

{
  PromiseError local_20;
  QPromiseCanceledException *local_18;
  QPromiseCanceledException *error_local;
  PromiseDataBase<void,_void_()> *this_local;
  
  local_18 = error;
  error_local = (QPromiseCanceledException *)this;
  PromiseError::PromiseError<QtPromise::QPromiseCanceledException>(&local_20,error);
  PromiseError::operator=(&this->m_error,&local_20);
  PromiseError::~PromiseError(&local_20);
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }